

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall tst_RoleMaskProxyModel::testMoveRowBefore(tst_RoleMaskProxyModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ModelTest *this_00;
  uint uVar4;
  anon_union_24_3_e3d07ef4_for_data local_c0;
  anon_union_24_3_e3d07ef4_for_data local_a0;
  QPersistentModelIndex proxyParentIdx;
  QModelIndex local_80;
  RoleMaskProxyModel proxyModel;
  int iStack_64;
  QPersistentModelIndex parentIdx;
  GenericModel baseModel;
  
  GenericModel::GenericModel(&baseModel,(QObject *)0x0);
  local_c0._forAlignment = -NAN;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  GenericModel::insertColumns((int)&baseModel,0,(QModelIndex *)0x2);
  iVar3 = (int)&local_c0;
  local_c0._forAlignment = -NAN;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  GenericModel::insertRows((int)&baseModel,0,(QModelIndex *)0x5);
  local_c0._forAlignment = -NAN;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  testMoveRowBefore::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&baseModel,(QAbstractItemModel *)local_c0.data,
             (QModelIndex *)0x0,iVar3);
  _proxyModel = -1;
  iStack_64 = -1;
  GenericModel::index((int)&local_c0,(int)&baseModel,(QModelIndex *)0x1);
  QPersistentModelIndex::QPersistentModelIndex(&parentIdx,(QModelIndex *)&local_c0);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c0,&parentIdx);
  GenericModel::insertColumns((int)&baseModel,0,(QModelIndex *)0x2);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c0,&parentIdx);
  iVar3 = (int)&local_c0;
  GenericModel::insertRows((int)&baseModel,0,(QModelIndex *)0x5);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c0,&parentIdx);
  testMoveRowBefore::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&baseModel,(QAbstractItemModel *)local_c0.data,
             (QModelIndex *)0x32,iVar3);
  RoleMaskProxyModel::RoleMaskProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,(QObject *)&baseModel);
  RoleMaskProxyModel::addMaskedRole((int)&proxyModel);
  RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_a0,&parentIdx);
  QIdentityProxyModel::mapFromSource((QModelIndex *)&local_c0);
  QPersistentModelIndex::QPersistentModelIndex(&proxyParentIdx,(QModelIndex *)&local_c0);
  uVar4 = 0;
  do {
    local_c0._forAlignment = -NAN;
    local_c0._8_8_ = 0;
    local_c0._16_8_ = 0;
    iVar3 = QIdentityProxyModel::rowCount((QModelIndex *)&proxyModel);
    if (iVar3 <= (int)uVar4) {
      uVar4 = 0;
      goto LAB_0010c67d;
    }
    local_80.r = -1;
    local_80.c = -1;
    local_80.i = 0;
    local_80.m = (QAbstractItemModel *)0x0;
    QIdentityProxyModel::index
              ((int)&local_a0,(int)(QModelIndex *)&proxyModel,(QModelIndex *)(ulong)uVar4);
    QVariant::QVariant((QVariant *)&local_c0,uVar4 + 1000);
    bVar1 = (bool)RoleMaskProxyModel::setData
                            ((QModelIndex *)&proxyModel,(QVariant *)&local_a0,(int)&local_c0);
    cVar2 = QTest::qVerify(bVar1,
                           "proxyModel.setData(proxyModel.index(i, 0), 1000 + i, Qt::UserRole)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0xfe);
    QVariant::~QVariant((QVariant *)&local_c0);
    uVar4 = uVar4 + 1;
  } while (cVar2 != '\0');
  goto LAB_0010d82e;
  while( true ) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&proxyParentIdx);
    QIdentityProxyModel::index
              ((int)&local_a0,(int)(QModelIndex *)&proxyModel,(QModelIndex *)(ulong)uVar4);
    QVariant::QVariant((QVariant *)&local_c0,uVar4 + 2000);
    bVar1 = (bool)RoleMaskProxyModel::setData
                            ((QModelIndex *)&proxyModel,(QVariant *)&local_a0,(int)&local_c0);
    cVar2 = QTest::qVerify(bVar1,
                           "proxyModel.setData(proxyModel.index(i, 0, proxyParentIdx), 2000 + i, Qt::UserRole)"
                           ,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x100);
    QVariant::~QVariant((QVariant *)&local_c0);
    uVar4 = uVar4 + 1;
    if (cVar2 == '\0') break;
LAB_0010c67d:
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c0,&proxyParentIdx);
    iVar3 = QIdentityProxyModel::rowCount((QModelIndex *)&proxyModel);
    if (iVar3 <= (int)uVar4) {
      local_c0._forAlignment = -NAN;
      local_c0._8_8_ = 0;
      local_c0._16_8_ = 0;
      local_a0._forAlignment = -NAN;
      local_a0._8_8_ = 0;
      local_a0._16_8_ = 0;
      bVar1 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&baseModel,(int)&local_c0,4,(QModelIndex *)0x1,
                               (int)&local_a0);
      cVar2 = QTest::qVerify(bVar1,"baseModel.moveRows(QModelIndex(), 4, 1, QModelIndex(), 1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x101);
      if (cVar2 != '\0') {
        local_80.r = -1;
        local_80.c = -1;
        local_80.i = 0;
        local_80.m = (QAbstractItemModel *)0x0;
        QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x0);
        QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
        iVar3 = QVariant::toInt((bool *)local_c0.data);
        cVar2 = QTest::qCompare(iVar3,1000,"proxyModel.index(0, 0).data(Qt::UserRole).toInt()",
                                "1000",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                ,0x102);
        QVariant::~QVariant((QVariant *)&local_c0);
        if (cVar2 != '\0') {
          local_80.r = -1;
          local_80.c = -1;
          local_80.i = 0;
          local_80.m = (QAbstractItemModel *)0x0;
          QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x1);
          QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
          iVar3 = QVariant::toInt((bool *)local_c0.data);
          cVar2 = QTest::qCompare(iVar3,0x3ec,"proxyModel.index(1, 0).data(Qt::UserRole).toInt()",
                                  "1004",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x103);
          QVariant::~QVariant((QVariant *)&local_c0);
          if (cVar2 != '\0') {
            local_80.r = -1;
            local_80.c = -1;
            local_80.i = 0;
            local_80.m = (QAbstractItemModel *)0x0;
            QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x2);
            QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
            iVar3 = QVariant::toInt((bool *)local_c0.data);
            cVar2 = QTest::qCompare(iVar3,0x3e9,"proxyModel.index(2, 0).data(Qt::UserRole).toInt()",
                                    "1001",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                    ,0x104);
            QVariant::~QVariant((QVariant *)&local_c0);
            if (cVar2 != '\0') {
              local_80.r = -1;
              local_80.c = -1;
              local_80.i = 0;
              local_80.m = (QAbstractItemModel *)0x0;
              QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x3);
              QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
              iVar3 = QVariant::toInt((bool *)local_c0.data);
              cVar2 = QTest::qCompare(iVar3,0x3ea,
                                      "proxyModel.index(3, 0).data(Qt::UserRole).toInt()","1002",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                      ,0x105);
              QVariant::~QVariant((QVariant *)&local_c0);
              if (cVar2 != '\0') {
                local_80.r = -1;
                local_80.c = -1;
                local_80.i = 0;
                local_80.m = (QAbstractItemModel *)0x0;
                QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x4);
                QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
                iVar3 = QVariant::toInt((bool *)local_c0.data);
                cVar2 = QTest::qCompare(iVar3,0x3eb,
                                        "proxyModel.index(4, 0).data(Qt::UserRole).toInt()","1003",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                        ,0x106);
                QVariant::~QVariant((QVariant *)&local_c0);
                if (cVar2 != '\0') {
                  QPersistentModelIndex::data((int)&local_c0);
                  iVar3 = QVariant::toInt((bool *)local_c0.data);
                  cVar2 = QTest::qCompare(iVar3,0x3e9,"proxyParentIdx.data(Qt::UserRole).toInt()",
                                          "1001",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                          ,0x107);
                  QVariant::~QVariant((QVariant *)&local_c0);
                  if (cVar2 != '\0') {
                    QPersistentModelIndex::operator_cast_to_QModelIndex
                              ((QModelIndex *)&local_c0,&parentIdx);
                    QPersistentModelIndex::operator_cast_to_QModelIndex
                              ((QModelIndex *)&local_a0,&parentIdx);
                    bVar1 = (bool)GenericModel::moveRows
                                            ((QModelIndex *)&baseModel,(int)&local_c0,4,
                                             (QModelIndex *)0x1,(int)&local_a0);
                    cVar2 = QTest::qVerify(bVar1,"baseModel.moveRows(parentIdx, 4, 1, parentIdx, 0)"
                                           ,"",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                           ,0x108);
                    if (cVar2 != '\0') {
                      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&proxyParentIdx)
                      ;
                      QIdentityProxyModel::index((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x0)
                      ;
                      QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
                      iVar3 = QVariant::toInt((bool *)local_c0.data);
                      cVar2 = QTest::qCompare(iVar3,0x7d4,
                                              "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                              ,"2004",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                              ,0x109);
                      QVariant::~QVariant((QVariant *)&local_c0);
                      if (cVar2 != '\0') {
                        QPersistentModelIndex::operator_cast_to_QModelIndex
                                  (&local_80,&proxyParentIdx);
                        QIdentityProxyModel::index
                                  ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x1);
                        QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
                        iVar3 = QVariant::toInt((bool *)local_c0.data);
                        cVar2 = QTest::qCompare(iVar3,2000,
                                                "proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                ,"2000",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                ,0x10a);
                        QVariant::~QVariant((QVariant *)&local_c0);
                        if (cVar2 != '\0') {
                          QPersistentModelIndex::operator_cast_to_QModelIndex
                                    (&local_80,&proxyParentIdx);
                          QIdentityProxyModel::index
                                    ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x2);
                          QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
                          iVar3 = QVariant::toInt((bool *)local_c0.data);
                          cVar2 = QTest::qCompare(iVar3,0x7d1,
                                                  "proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x10b);
                          QVariant::~QVariant((QVariant *)&local_c0);
                          if (cVar2 != '\0') {
                            QPersistentModelIndex::operator_cast_to_QModelIndex
                                      (&local_80,&proxyParentIdx);
                            QIdentityProxyModel::index
                                      ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x3);
                            QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100);
                            iVar3 = QVariant::toInt((bool *)local_c0.data);
                            cVar2 = QTest::qCompare(iVar3,0x7d2,
                                                                                                        
                                                  "proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x10c);
                            QVariant::~QVariant((QVariant *)&local_c0);
                            if (cVar2 != '\0') {
                              QPersistentModelIndex::operator_cast_to_QModelIndex
                                        (&local_80,&proxyParentIdx);
                              QIdentityProxyModel::index
                                        ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x4);
                              QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,0x100
                                               );
                              iVar3 = QVariant::toInt((bool *)local_c0.data);
                              cVar2 = QTest::qCompare(iVar3,0x7d3,
                                                                                                            
                                                  "proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x10d);
                              QVariant::~QVariant((QVariant *)&local_c0);
                              if (cVar2 != '\0') {
                                QPersistentModelIndex::operator_cast_to_QModelIndex
                                          ((QModelIndex *)&local_c0,&parentIdx);
                                local_a0._forAlignment = -NAN;
                                local_a0._8_8_ = 0;
                                local_a0._16_8_ = 0;
                                bVar1 = (bool)GenericModel::moveRows
                                                        ((QModelIndex *)&baseModel,(int)&local_c0,3,
                                                         (QModelIndex *)0x1,(int)&local_a0);
                                cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveRows(parentIdx, 3, 1, QModelIndex(), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x10e);
                                if (cVar2 != '\0') {
                                  QPersistentModelIndex::operator_cast_to_QModelIndex
                                            (&local_80,&proxyParentIdx);
                                  QIdentityProxyModel::index
                                            ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x0);
                                  QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0,
                                                    0x100);
                                  iVar3 = QVariant::toInt((bool *)local_c0.data);
                                  cVar2 = QTest::qCompare(iVar3,0x7d4,
                                                                                                                    
                                                  "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x10f);
                                  QVariant::~QVariant((QVariant *)&local_c0);
                                  if (cVar2 != '\0') {
                                    QPersistentModelIndex::operator_cast_to_QModelIndex
                                              (&local_80,&proxyParentIdx);
                                    QIdentityProxyModel::index
                                              ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x1);
                                    QModelIndex::data((QVariant *)&local_c0,(QModelIndex *)&local_a0
                                                      ,0x100);
                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                    cVar2 = QTest::qCompare(iVar3,2000,
                                                                                                                        
                                                  "proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x110);
                                    QVariant::~QVariant((QVariant *)&local_c0);
                                    if (cVar2 != '\0') {
                                      QPersistentModelIndex::operator_cast_to_QModelIndex
                                                (&local_80,&proxyParentIdx);
                                      QIdentityProxyModel::index
                                                ((int)&local_a0,(int)&proxyModel,(QModelIndex *)0x2)
                                      ;
                                      QModelIndex::data((QVariant *)&local_c0,
                                                        (QModelIndex *)&local_a0,0x100);
                                      iVar3 = QVariant::toInt((bool *)local_c0.data);
                                      cVar2 = QTest::qCompare(iVar3,0x7d1,
                                                                                                                            
                                                  "proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x111);
                                      QVariant::~QVariant((QVariant *)&local_c0);
                                      if (cVar2 != '\0') {
                                        QPersistentModelIndex::operator_cast_to_QModelIndex
                                                  (&local_80,&proxyParentIdx);
                                        QIdentityProxyModel::index
                                                  ((int)&local_a0,(int)&proxyModel,
                                                   (QModelIndex *)0x3);
                                        QModelIndex::data((QVariant *)&local_c0,
                                                          (QModelIndex *)&local_a0,0x100);
                                        iVar3 = QVariant::toInt((bool *)local_c0.data);
                                        cVar2 = QTest::qCompare(iVar3,0x7d3,
                                                                                                                                
                                                  "proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x112);
                                        QVariant::~QVariant((QVariant *)&local_c0);
                                        if (cVar2 != '\0') {
                                          local_80.r = -1;
                                          local_80.c = -1;
                                          local_80.i = 0;
                                          local_80.m = (QAbstractItemModel *)0x0;
                                          QIdentityProxyModel::index
                                                    ((int)&local_a0,(int)&proxyModel,
                                                     (QModelIndex *)0x0);
                                          QModelIndex::data((QVariant *)&local_c0,
                                                            (QModelIndex *)&local_a0,0x100);
                                          iVar3 = QVariant::toInt((bool *)local_c0.data);
                                          cVar2 = QTest::qCompare(iVar3,0x7d2,
                                                                                                                                    
                                                  "proxyModel.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x113);
                                          QVariant::~QVariant((QVariant *)&local_c0);
                                          if (cVar2 != '\0') {
                                            local_80.r = -1;
                                            local_80.c = -1;
                                            local_80.i = 0;
                                            local_80.m = (QAbstractItemModel *)0x0;
                                            QIdentityProxyModel::index
                                                      ((int)&local_a0,(int)&proxyModel,
                                                       (QModelIndex *)0x1);
                                            QModelIndex::data((QVariant *)&local_c0,
                                                              (QModelIndex *)&local_a0,0x100);
                                            iVar3 = QVariant::toInt((bool *)local_c0.data);
                                            cVar2 = QTest::qCompare(iVar3,1000,
                                                                                                                                        
                                                  "proxyModel.index(1, 0).data(Qt::UserRole).toInt()"
                                                  ,"1000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x114);
                                            QVariant::~QVariant((QVariant *)&local_c0);
                                            if (cVar2 != '\0') {
                                              local_80.r = -1;
                                              local_80.c = -1;
                                              local_80.i = 0;
                                              local_80.m = (QAbstractItemModel *)0x0;
                                              QIdentityProxyModel::index
                                                        ((int)&local_a0,(int)&proxyModel,
                                                         (QModelIndex *)0x2);
                                              QModelIndex::data((QVariant *)&local_c0,
                                                                (QModelIndex *)&local_a0,0x100);
                                              iVar3 = QVariant::toInt((bool *)local_c0.data);
                                              cVar2 = QTest::qCompare(iVar3,0x3ec,
                                                                                                                                            
                                                  "proxyModel.index(2, 0).data(Qt::UserRole).toInt()"
                                                  ,"1004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x115);
                                              QVariant::~QVariant((QVariant *)&local_c0);
                                              if (cVar2 != '\0') {
                                                local_80.r = -1;
                                                local_80.c = -1;
                                                local_80.i = 0;
                                                local_80.m = (QAbstractItemModel *)0x0;
                                                QIdentityProxyModel::index
                                                          ((int)&local_a0,(int)&proxyModel,
                                                           (QModelIndex *)0x3);
                                                QModelIndex::data((QVariant *)&local_c0,
                                                                  (QModelIndex *)&local_a0,0x100);
                                                iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                cVar2 = QTest::qCompare(iVar3,0x3e9,
                                                                                                                                                
                                                  "proxyModel.index(3, 0).data(Qt::UserRole).toInt()"
                                                  ,"1001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x116);
                                                QVariant::~QVariant((QVariant *)&local_c0);
                                                if (cVar2 != '\0') {
                                                  local_80.r = -1;
                                                  local_80.c = -1;
                                                  local_80.i = 0;
                                                  local_80.m = (QAbstractItemModel *)0x0;
                                                  QIdentityProxyModel::index
                                                            ((int)&local_a0,(int)&proxyModel,
                                                             (QModelIndex *)0x4);
                                                  QModelIndex::data((QVariant *)&local_c0,
                                                                    (QModelIndex *)&local_a0,0x100);
                                                  iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                  cVar2 = QTest::qCompare(iVar3,0x3ea,
                                                                                                                                                    
                                                  "proxyModel.index(4, 0).data(Qt::UserRole).toInt()"
                                                  ,"1002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x117);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x5);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x3eb,
                                                                                                                                                        
                                                  "proxyModel.index(5, 0).data(Qt::UserRole).toInt()"
                                                  ,"1003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x118);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_c0._forAlignment = -NAN;
                                                    local_c0._8_8_ = 0;
                                                    local_c0._16_8_ = 0;
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              ((QModelIndex *)&local_a0,&parentIdx);
                                                    bVar1 = (bool)GenericModel::moveRows
                                                                            ((QModelIndex *)
                                                                             &baseModel,
                                                                             (int)&local_c0,4,
                                                                             (QModelIndex *)0x1,
                                                                             (int)&local_a0);
                                                    cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveRows(QModelIndex(), 4, 1, parentIdx, 1)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x119);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x7d2,
                                                                                                                                                        
                                                  "proxyModel.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11a);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x1);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,1000,
                                                                                                                                                        
                                                  "proxyModel.index(1, 0).data(Qt::UserRole).toInt()"
                                                  ,"1000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11b);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x2);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x3ec,
                                                                                                                                                        
                                                  "proxyModel.index(2, 0).data(Qt::UserRole).toInt()"
                                                  ,"1004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11c);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x3);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x3e9,
                                                                                                                                                        
                                                  "proxyModel.index(3, 0).data(Qt::UserRole).toInt()"
                                                  ,"1001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11d);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x4);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x3eb,
                                                                                                                                                        
                                                  "proxyModel.index(4, 0).data(Qt::UserRole).toInt()"
                                                  ,"1003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11e);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_80,&proxyParentIdx);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x7d4,
                                                                                                                                                        
                                                  "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11f);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_80,&proxyParentIdx);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x1);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x3ea,
                                                                                                                                                        
                                                  "proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"1002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x120);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_80,&proxyParentIdx);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x2);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,2000,
                                                                                                                                                        
                                                  "proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x121);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_80,&proxyParentIdx);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x3);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    cVar2 = QTest::qCompare(iVar3,0x7d1,
                                                                                                                                                        
                                                  "proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x122);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_80,&proxyParentIdx);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&proxyModel,
                                                               (QModelIndex *)0x4);
                                                    QModelIndex::data((QVariant *)&local_c0,
                                                                      (QModelIndex *)&local_a0,0x100
                                                                     );
                                                    iVar3 = QVariant::toInt((bool *)local_c0.data);
                                                    QTest::qCompare(iVar3,0x7d3,
                                                                                                                                        
                                                  "proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x123);
                                                  QVariant::~QVariant((QVariant *)&local_c0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
LAB_0010d82e:
  QPersistentModelIndex::~QPersistentModelIndex(&proxyParentIdx);
  RoleMaskProxyModel::~RoleMaskProxyModel(&proxyModel);
  QPersistentModelIndex::~QPersistentModelIndex(&parentIdx);
  GenericModel::~GenericModel(&baseModel);
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testMoveRowBefore()
{
#ifdef QTMODELUTILITIES_GENERICMODEL
    const auto fillData = [](QAbstractItemModel *model, const QModelIndex &parent = QModelIndex(), int shift = 0) {
        for (int i = 0, maxI = model->rowCount(parent); i < maxI; ++i) {
            for (int j = 0, maxJ = model->columnCount(parent); j < maxJ; ++j) {
                model->setData(model->index(i, j, parent), i + shift, Qt::UserRole);
                model->setData(model->index(i, j, parent), j + shift, Qt::UserRole + 1);
            }
        }
    };
    GenericModel baseModel;
    baseModel.insertColumns(0, 2);
    baseModel.insertRows(0, 5);
    fillData(&baseModel);
    const QPersistentModelIndex parentIdx = baseModel.index(1, 0);
    baseModel.insertColumns(0, 2, parentIdx);
    baseModel.insertRows(0, 5, parentIdx);
    fillData(&baseModel, parentIdx, 50);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, &baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setSourceModel(&baseModel);
    const QPersistentModelIndex proxyParentIdx = proxyModel.mapFromSource(parentIdx);
    for (int i = 0; i < proxyModel.rowCount(); ++i)
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0), 1000 + i, Qt::UserRole));
    for (int i = 0; i < proxyModel.rowCount(proxyParentIdx); ++i)
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0, proxyParentIdx), 2000 + i, Qt::UserRole));
    QVERIFY(baseModel.moveRows(QModelIndex(), 4, 1, QModelIndex(), 1));
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(1, 0).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(2, 0).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(3, 0).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(4, 0).data(Qt::UserRole).toInt(), 1003);
    QCOMPARE(proxyParentIdx.data(Qt::UserRole).toInt(), 1001);
    QVERIFY(baseModel.moveRows(parentIdx, 4, 1, parentIdx, 0));
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QVERIFY(baseModel.moveRows(parentIdx, 3, 1, QModelIndex(), 0));
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(1, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(2, 0).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(3, 0).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(4, 0).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(5, 0).data(Qt::UserRole).toInt(), 1003);
    QVERIFY(baseModel.moveRows(QModelIndex(), 4, 1, parentIdx, 1));
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(1, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(2, 0).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(3, 0).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(4, 0).data(Qt::UserRole).toInt(), 1003);
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
#else
    QSKIP("This test requires the GenericModel module");
#endif
}